

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_normal.c
# Opt level: O0

bool_t prf_obsolete_vertex_with_normal_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict10 *data;
  int pos;
  uint32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar1;
  
  if (*in_RDI == prf_obsolete_vertex_with_normal_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
    bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
    bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
    if (0x10 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar1 = 1;
  }
  else {
    prf_error(9,"tried vertex with normal (obs) save method for node of type %d.",(ulong)*in_RDI);
    bVar1 = 0;
  }
  return bVar1;
}

Assistant:

static
bool_t
prf_obsolete_vertex_with_normal_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_obsolete_vertex_with_normal_info.opcode ) {
        prf_error( 9,
            "tried vertex with normal (obs) save method for node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        assert( node->data != NULL );
        data = (node_data *) node->data;
        bf_put_uint32_be( bfile, data->x ); pos += 4;
        bf_put_uint32_be( bfile, data->y ); pos += 4;
        bf_put_uint32_be( bfile, data->z ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}